

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseMinimizer.cpp
# Opt level: O2

void __thiscall TraverseMinimizer::dfs(TraverseMinimizer *this,Node *node)

{
  undefined8 *puVar1;
  deque<Node*,std::allocator<Node*>> *this_00;
  long lVar2;
  undefined8 *puVar3;
  Node *neighbor;
  
  this_00 = (deque<Node*,std::allocator<Node*>> *)operator_new(0x50);
  std::stack<Node*,std::deque<Node*,std::allocator<Node*>>>::
  stack<std::deque<Node*,std::allocator<Node*>>,void>
            ((stack<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)this_00);
  neighbor = node;
  std::deque<Node*,std::allocator<Node*>>::emplace_back<Node*>(this_00,&neighbor);
  while (lVar2 = *(long *)(this_00 + 0x30), lVar2 != *(long *)(this_00 + 0x10)) {
    if (lVar2 == *(long *)(this_00 + 0x38)) {
      lVar2 = *(long *)(*(long *)(this_00 + 0x48) + -8) + 0x200;
    }
    lVar2 = *(long *)(lVar2 + -8);
    std::deque<Node_*,_std::allocator<Node_*>_>::pop_back
              ((deque<Node_*,_std::allocator<Node_*>_> *)this_00);
    if (*(char *)(lVar2 + 9) == '\0') {
      *(undefined1 *)(lVar2 + 9) = 1;
      puVar1 = *(undefined8 **)(lVar2 + 0x18);
      for (puVar3 = *(undefined8 **)(lVar2 + 0x10); puVar3 != puVar1; puVar3 = puVar3 + 1) {
        neighbor = (Node *)*puVar3;
        if (neighbor->marked == true) {
          removeMark(this,neighbor);
        }
        else if (neighbor->visited == false) {
          std::deque<Node_*,_std::allocator<Node_*>_>::push_back
                    ((deque<Node_*,_std::allocator<Node_*>_> *)this_00,&neighbor);
        }
      }
    }
  }
  std::_Deque_base<Node_*,_std::allocator<Node_*>_>::~_Deque_base
            ((_Deque_base<Node_*,_std::allocator<Node_*>_> *)this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void TraverseMinimizer::dfs(Node& node) {
    auto pile = new std::stack<Node*>;
    pile->push(&node);

    while (!pile->empty()) {
        auto v = pile->top();
        pile->pop();

        if (v->visited) continue;
        v->visited = true;

        for (auto neighbor : v->neighbors) {
            if (neighbor->marked) {
                removeMark(*neighbor);
                continue;
            }
            if (neighbor->visited) continue;
            pile->push(neighbor);
        }
    }
    delete pile;
}